

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3RunParser(Parse *pParse,char *zSql,char **pzErrMsg)

{
  u8 uVar1;
  int iVar2;
  sqlite3 *db_00;
  undefined8 *p_00;
  Table *pTable;
  int iVar3;
  char **pz;
  char *pcVar4;
  bool bVar5;
  Token yyminor;
  Token yyminor_00;
  Token yyminor_01;
  Table *p_1;
  AutoincInfo *p;
  int mxSqlLen;
  sqlite3 *db;
  int local_40;
  int iStack_3c;
  u8 enableLookaside;
  int lastTokenParsed;
  int tokenType;
  void *pEngine;
  int i;
  int nErr;
  char **pzErrMsg_local;
  char *zSql_local;
  Parse *pParse_local;
  
  pEngine._4_4_ = 0;
  local_40 = -1;
  db_00 = pParse->db;
  iVar2 = db_00->aLimit[1];
  if (db_00->activeVdbeCnt == 0) {
    (db_00->u1).isInterrupted = 0;
  }
  pParse->rc = 0;
  pParse->zTail = zSql;
  pEngine._0_4_ = 0;
  _i = pzErrMsg;
  pzErrMsg_local = (char **)zSql;
  zSql_local = (char *)pParse;
  _lastTokenParsed = sqlite3ParserAlloc(sqlite3Malloc);
  if (_lastTokenParsed == (void *)0x0) {
    db_00->mallocFailed = '\x01';
    pParse_local._4_4_ = 7;
  }
  else {
    uVar1 = (db_00->lookaside).bEnabled;
    if ((db_00->lookaside).pStart != (void *)0x0) {
      (db_00->lookaside).bEnabled = '\x01';
    }
LAB_0017b409:
    do {
      bVar5 = false;
      if (db_00->mallocFailed == '\0') {
        bVar5 = *(char *)((long)pzErrMsg_local + (long)(int)pEngine) != '\0';
      }
      if (!bVar5) break;
      *(long *)(zSql_local + 0x260) = (long)pzErrMsg_local + (long)(int)pEngine;
      iVar3 = sqlite3GetToken((uchar *)((long)pzErrMsg_local + (long)(int)pEngine),
                              &stack0xffffffffffffffc4);
      *(int *)(zSql_local + 0x268) = iVar3;
      pEngine._0_4_ = *(int *)(zSql_local + 0x268) + (int)pEngine;
      if (iVar2 < (int)pEngine) {
        zSql_local[0x18] = '\x12';
        zSql_local[0x19] = '\0';
        zSql_local[0x1a] = '\0';
        zSql_local[0x1b] = '\0';
        break;
      }
      if (iStack_3c == 1) {
        *(long *)(zSql_local + 0x230) = (long)pzErrMsg_local + (long)(int)pEngine;
      }
      else {
        if (iStack_3c == 0x94) {
          sqlite3DbFree(db_00,*_i);
          pcVar4 = sqlite3MPrintf(db_00,"unrecognized token: \"%T\"",zSql_local + 0x260);
          *_i = pcVar4;
          pEngine._4_4_ = pEngine._4_4_ + 1;
          break;
        }
        if (iStack_3c == 0x95) {
          if ((db_00->u1).isInterrupted != 0) {
            sqlite3ErrorMsg((Parse *)zSql_local,"interrupt");
            zSql_local[0x18] = '\t';
            zSql_local[0x19] = '\0';
            zSql_local[0x1a] = '\0';
            zSql_local[0x1b] = '\0';
            break;
          }
          goto LAB_0017b409;
        }
      }
      yyminor._12_4_ = 0;
      yyminor._0_12_ = *(undefined1 (*) [12])(zSql_local + 0x260);
      sqlite3Parser(_lastTokenParsed,iStack_3c,yyminor,(Parse *)zSql_local);
      local_40 = iStack_3c;
    } while (*(int *)(zSql_local + 0x18) == 0);
    if (((*(char *)((long)pzErrMsg_local + (long)(int)pEngine) == '\0') && (pEngine._4_4_ == 0)) &&
       (*(int *)(zSql_local + 0x18) == 0)) {
      if (local_40 != 1) {
        yyminor_00._12_4_ = 0;
        yyminor_00._0_12_ = *(undefined1 (*) [12])(zSql_local + 0x260);
        sqlite3Parser(_lastTokenParsed,1,yyminor_00,(Parse *)zSql_local);
        *(long *)(zSql_local + 0x230) = (long)pzErrMsg_local + (long)(int)pEngine;
      }
      yyminor_01._12_4_ = 0;
      yyminor_01._0_12_ = *(undefined1 (*) [12])(zSql_local + 0x260);
      sqlite3Parser(_lastTokenParsed,0,yyminor_01,(Parse *)zSql_local);
    }
    sqlite3ParserFree(_lastTokenParsed,sqlite3_free);
    (db_00->lookaside).bEnabled = uVar1;
    if (db_00->mallocFailed != '\0') {
      zSql_local[0x18] = '\a';
      zSql_local[0x19] = '\0';
      zSql_local[0x1a] = '\0';
      zSql_local[0x1b] = '\0';
    }
    if (((*(int *)(zSql_local + 0x18) != 0) && (*(int *)(zSql_local + 0x18) != 0x65)) &&
       (*(long *)(zSql_local + 8) == 0)) {
      pz = (char **)(zSql_local + 8);
      pcVar4 = sqlite3ErrStr(*(int *)(zSql_local + 0x18));
      sqlite3SetString(pz,db_00,"%s",pcVar4);
    }
    if (*(long *)(zSql_local + 8) != 0) {
      *_i = *(char **)(zSql_local + 8);
      sqlite3_log(*(int *)(zSql_local + 0x18),"%s",*_i);
      zSql_local[8] = '\0';
      zSql_local[9] = '\0';
      zSql_local[10] = '\0';
      zSql_local[0xb] = '\0';
      zSql_local[0xc] = '\0';
      zSql_local[0xd] = '\0';
      zSql_local[0xe] = '\0';
      zSql_local[0xf] = '\0';
      pEngine._4_4_ = pEngine._4_4_ + 1;
    }
    if (((*(long *)(zSql_local + 0x10) != 0) && (0 < *(int *)(zSql_local + 0x50))) &&
       (zSql_local[0x1e] == '\0')) {
      sqlite3VdbeDelete(*(Vdbe **)(zSql_local + 0x10));
      zSql_local[0x10] = '\0';
      zSql_local[0x11] = '\0';
      zSql_local[0x12] = '\0';
      zSql_local[0x13] = '\0';
      zSql_local[0x14] = '\0';
      zSql_local[0x15] = '\0';
      zSql_local[0x16] = '\0';
      zSql_local[0x17] = '\0';
    }
    if (zSql_local[0x1e] == '\0') {
      sqlite3DbFree(db_00,*(void **)(zSql_local + 0x1c0));
      zSql_local[0x1c0] = '\0';
      zSql_local[0x1c1] = '\0';
      zSql_local[0x1c2] = '\0';
      zSql_local[0x1c3] = '\0';
      zSql_local[0x1c4] = '\0';
      zSql_local[0x1c5] = '\0';
      zSql_local[0x1c6] = '\0';
      zSql_local[0x1c7] = '\0';
      zSql_local[0x1b8] = '\0';
      zSql_local[0x1b9] = '\0';
      zSql_local[0x1ba] = '\0';
      zSql_local[0x1bb] = '\0';
    }
    sqlite3_free(*(void **)(zSql_local + 0x280));
    if (zSql_local[0x1fd] == '\0') {
      sqlite3DeleteTable(db_00,*(Table **)(zSql_local + 0x238));
    }
    sqlite3DeleteTrigger(db_00,*(Trigger **)(zSql_local + 0x240));
    pEngine._0_4_ = *(int *)(zSql_local + 0x1f8);
    while (pEngine._0_4_ = (int)pEngine + -1, -1 < (int)pEngine) {
      sqlite3DbFree(db_00,*(void **)(*(long *)(zSql_local + 0x218) + (long)(int)pEngine * 8));
    }
    sqlite3DbFree(db_00,*(void **)(zSql_local + 0x218));
    sqlite3DbFree(db_00,*(void **)(zSql_local + 0x228));
    while (*(long *)(zSql_local + 0x1c8) != 0) {
      p_00 = *(undefined8 **)(zSql_local + 0x1c8);
      *(undefined8 *)(zSql_local + 0x1c8) = *p_00;
      sqlite3DbFree(db_00,p_00);
    }
    while (*(long *)(zSql_local + 0x288) != 0) {
      pTable = *(Table **)(zSql_local + 0x288);
      *(Table **)(zSql_local + 0x288) = pTable->pNextZombie;
      sqlite3DeleteTable(db_00,pTable);
    }
    if ((0 < pEngine._4_4_) && (*(int *)(zSql_local + 0x18) == 0)) {
      zSql_local[0x18] = '\x01';
      zSql_local[0x19] = '\0';
      zSql_local[0x1a] = '\0';
      zSql_local[0x1b] = '\0';
    }
    pParse_local._4_4_ = pEngine._4_4_;
  }
  return pParse_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3RunParser(Parse *pParse, const char *zSql, char **pzErrMsg){
  int nErr = 0;                   /* Number of errors encountered */
  int i;                          /* Loop counter */
  void *pEngine;                  /* The LEMON-generated LALR(1) parser */
  int tokenType;                  /* type of the next token */
  int lastTokenParsed = -1;       /* type of the previous token */
  u8 enableLookaside;             /* Saved value of db->lookaside.bEnabled */
  sqlite3 *db = pParse->db;       /* The database connection */
  int mxSqlLen;                   /* Max length of an SQL string */


  mxSqlLen = db->aLimit[SQLITE_LIMIT_SQL_LENGTH];
  if( db->activeVdbeCnt==0 ){
    db->u1.isInterrupted = 0;
  }
  pParse->rc = SQLITE_OK;
  pParse->zTail = zSql;
  i = 0;
  assert( pzErrMsg!=0 );
  pEngine = sqlite3ParserAlloc((void*(*)(size_t))sqlite3Malloc);
  if( pEngine==0 ){
    db->mallocFailed = 1;
    return SQLITE_NOMEM;
  }
  assert( pParse->pNewTable==0 );
  assert( pParse->pNewTrigger==0 );
  assert( pParse->nVar==0 );
  assert( pParse->nzVar==0 );
  assert( pParse->azVar==0 );
  enableLookaside = db->lookaside.bEnabled;
  if( db->lookaside.pStart ) db->lookaside.bEnabled = 1;
  while( !db->mallocFailed && zSql[i]!=0 ){
    assert( i>=0 );
    pParse->sLastToken.z = &zSql[i];
    pParse->sLastToken.n = sqlite3GetToken((unsigned char*)&zSql[i],&tokenType);
    i += pParse->sLastToken.n;
    if( i>mxSqlLen ){
      pParse->rc = SQLITE_TOOBIG;
      break;
    }
    switch( tokenType ){
      case TK_SPACE: {
        if( db->u1.isInterrupted ){
          sqlite3ErrorMsg(pParse, "interrupt");
          pParse->rc = SQLITE_INTERRUPT;
          goto abort_parse;
        }
        break;
      }
      case TK_ILLEGAL: {
        sqlite3DbFree(db, *pzErrMsg);
        *pzErrMsg = sqlite3MPrintf(db, "unrecognized token: \"%T\"",
                        &pParse->sLastToken);
        nErr++;
        goto abort_parse;
      }
      case TK_SEMI: {
        pParse->zTail = &zSql[i];
        /* Fall thru into the default case */
      }
      default: {
        sqlite3Parser(pEngine, tokenType, pParse->sLastToken, pParse);
        lastTokenParsed = tokenType;
        if( pParse->rc!=SQLITE_OK ){
          goto abort_parse;
        }
        break;
      }
    }
  }
abort_parse:
  if( zSql[i]==0 && nErr==0 && pParse->rc==SQLITE_OK ){
    if( lastTokenParsed!=TK_SEMI ){
      sqlite3Parser(pEngine, TK_SEMI, pParse->sLastToken, pParse);
      pParse->zTail = &zSql[i];
    }
    sqlite3Parser(pEngine, 0, pParse->sLastToken, pParse);
  }
#ifdef YYTRACKMAXSTACKDEPTH
  sqlite3StatusSet(SQLITE_STATUS_PARSER_STACK,
      sqlite3ParserStackPeak(pEngine)
  );
#endif /* YYDEBUG */
  sqlite3ParserFree(pEngine, sqlite3_free);
  db->lookaside.bEnabled = enableLookaside;
  if( db->mallocFailed ){
    pParse->rc = SQLITE_NOMEM;
  }
  if( pParse->rc!=SQLITE_OK && pParse->rc!=SQLITE_DONE && pParse->zErrMsg==0 ){
    sqlite3SetString(&pParse->zErrMsg, db, "%s", sqlite3ErrStr(pParse->rc));
  }
  assert( pzErrMsg!=0 );
  if( pParse->zErrMsg ){
    *pzErrMsg = pParse->zErrMsg;
    sqlite3_log(pParse->rc, "%s", *pzErrMsg);
    pParse->zErrMsg = 0;
    nErr++;
  }
  if( pParse->pVdbe && pParse->nErr>0 && pParse->nested==0 ){
    sqlite3VdbeDelete(pParse->pVdbe);
    pParse->pVdbe = 0;
  }
#ifndef SQLITE_OMIT_SHARED_CACHE
  if( pParse->nested==0 ){
    sqlite3DbFree(db, pParse->aTableLock);
    pParse->aTableLock = 0;
    pParse->nTableLock = 0;
  }
#endif
#ifndef SQLITE_OMIT_VIRTUALTABLE
  sqlite3_free(pParse->apVtabLock);
#endif

  if( !IN_DECLARE_VTAB ){
    /* If the pParse->declareVtab flag is set, do not delete any table 
    ** structure built up in pParse->pNewTable. The calling code (see vtab.c)
    ** will take responsibility for freeing the Table structure.
    */
    sqlite3DeleteTable(db, pParse->pNewTable);
  }

  sqlite3DeleteTrigger(db, pParse->pNewTrigger);
  for(i=pParse->nzVar-1; i>=0; i--) sqlite3DbFree(db, pParse->azVar[i]);
  sqlite3DbFree(db, pParse->azVar);
  sqlite3DbFree(db, pParse->aAlias);
  while( pParse->pAinc ){
    AutoincInfo *p = pParse->pAinc;
    pParse->pAinc = p->pNext;
    sqlite3DbFree(db, p);
  }
  while( pParse->pZombieTab ){
    Table *p = pParse->pZombieTab;
    pParse->pZombieTab = p->pNextZombie;
    sqlite3DeleteTable(db, p);
  }
  if( nErr>0 && pParse->rc==SQLITE_OK ){
    pParse->rc = SQLITE_ERROR;
  }
  return nErr;
}